

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qerrormessage.cpp
# Opt level: O0

void __thiscall QErrorMessagePrivate::retranslateStrings(QErrorMessagePrivate *this)

{
  QAbstractButton *in_RDI;
  long in_FS_OFFSET;
  int n;
  QString *text;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  text = &local_20;
  n = (int)((ulong)*(undefined8 *)&in_RDI[0x12].super_QWidget.field_0x18 >> 0x20);
  QErrorMessage::tr((char *)in_RDI,(char *)text,n);
  QAbstractButton::setText(in_RDI,text);
  QString::~QString((QString *)0x748260);
  QErrorMessage::tr((char *)in_RDI,(char *)text,n);
  QAbstractButton::setText(in_RDI,text);
  QString::~QString((QString *)0x7482a9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QErrorMessagePrivate::retranslateStrings()
{
    again->setText(QErrorMessage::tr("&Show this message again"));
    ok->setText(QErrorMessage::tr("&OK"));
}